

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestCaseInfo::swap(TestCaseInfo *this,TestCaseInfo *other)

{
  ITestCase *pIVar1;
  pointer pcVar2;
  long *local_58 [2];
  long local_48 [2];
  size_t local_38;
  
  pIVar1 = (this->m_test).m_p;
  (this->m_test).m_p = (other->m_test).m_p;
  (other->m_test).m_p = pIVar1;
  std::__cxx11::string::swap((string *)&this->m_className);
  std::__cxx11::string::swap((string *)&this->m_name);
  std::__cxx11::string::swap((string *)&this->m_description);
  pcVar2 = (this->m_lineInfo).file._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + (this->m_lineInfo).file._M_string_length);
  local_38 = (this->m_lineInfo).line;
  std::__cxx11::string::_M_assign((string *)&this->m_lineInfo);
  (this->m_lineInfo).line = (other->m_lineInfo).line;
  std::__cxx11::string::_M_assign((string *)&other->m_lineInfo);
  (other->m_lineInfo).line = local_38;
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void TestCaseInfo::swap( TestCaseInfo& other ) {
        m_test.swap( other.m_test );
        m_className.swap( other.m_className );
        m_name.swap( other.m_name );
        m_description.swap( other.m_description );
        std::swap( m_lineInfo, other.m_lineInfo );
    }